

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_swab.c
# Opt level: O0

void TIFFReverseBits(uint8_t *cp,tmsize_t n)

{
  long local_18;
  tmsize_t n_local;
  uint8_t *cp_local;
  
  n_local = (tmsize_t)cp;
  for (local_18 = n; 8 < local_18; local_18 = local_18 + -8) {
    *(uchar *)n_local = ""[*(byte *)n_local];
    *(uchar *)(n_local + 1) = ""[*(byte *)(n_local + 1)];
    *(uchar *)(n_local + 2) = ""[*(byte *)(n_local + 2)];
    *(uchar *)(n_local + 3) = ""[*(byte *)(n_local + 3)];
    *(uchar *)(n_local + 4) = ""[*(byte *)(n_local + 4)];
    *(uchar *)(n_local + 5) = ""[*(byte *)(n_local + 5)];
    *(uchar *)(n_local + 6) = ""[*(byte *)(n_local + 6)];
    *(uchar *)(n_local + 7) = ""[*(byte *)(n_local + 7)];
    n_local = n_local + 8;
  }
  while (0 < local_18) {
    *(uchar *)n_local = ""[*(byte *)n_local];
    n_local = n_local + 1;
    local_18 = local_18 + -1;
  }
  return;
}

Assistant:

void TIFFReverseBits(uint8_t *cp, tmsize_t n)
{
    for (; n > 8; n -= 8)
    {
        cp[0] = TIFFBitRevTable[cp[0]];
        cp[1] = TIFFBitRevTable[cp[1]];
        cp[2] = TIFFBitRevTable[cp[2]];
        cp[3] = TIFFBitRevTable[cp[3]];
        cp[4] = TIFFBitRevTable[cp[4]];
        cp[5] = TIFFBitRevTable[cp[5]];
        cp[6] = TIFFBitRevTable[cp[6]];
        cp[7] = TIFFBitRevTable[cp[7]];
        cp += 8;
    }
    while (n-- > 0)
    {
        *cp = TIFFBitRevTable[*cp];
        cp++;
    }
}